

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_mnist.hpp
# Opt level: O2

void pico_tree::read_mnist_images
               (string *filename,
               vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
               *images)

{
  array<std::byte,_784UL> *values;
  int iVar1;
  runtime_error *prVar2;
  header header;
  big_endian<int> magic_number;
  stream_wrapper wrapper;
  fstream stream;
  
  internal::open_stream((string *)&stream,(openmode)filename);
  wrapper.stream_ = (iostream *)&stream;
  internal::stream_wrapper::read<pico_tree::internal::big_endian<int>>(&wrapper,&magic_number);
  iVar1 = internal::big_endian_to_native<int>(magic_number.value);
  if (iVar1 != 0x803) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar2,"expected mnist images signature");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  internal::stream_wrapper::read<pico_tree::internal::mnist_images::header>(&wrapper,&header);
  header.image_count = internal::big_endian_to_native<int>(header.image_count);
  header.image_width = internal::big_endian_to_native<int>(header.image_width);
  header.image_height = internal::big_endian_to_native<int>(header.image_height);
  if (header.image_height * header.image_width == 0x310) {
    std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
    resize(images,(long)header.image_count);
    values = (images->
             super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    internal::stream_wrapper::read<std::array<std::byte,784ul>>
              (&wrapper,((long)(images->
                               super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)values) / 0x310,
               values);
    ::std::fstream::~fstream(&stream);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar2,"unexpected mnist image dimensions");
  __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void read_mnist_images(
    std::string const& filename,
    std::vector<std::array<std::byte, 28 * 28>>& images) {
  using namespace internal;

  std::fstream stream = open_stream(filename, std::ios::in | std::ios::binary);
  stream_wrapper wrapper(stream);

  big_endian<std::int32_t> magic_number;
  wrapper.read(magic_number);
  if (magic_number() != mnist_images::header::magic_number) {
    throw std::runtime_error("expected mnist images signature");
  }

  mnist_images::header header;
  wrapper.read(header);
  header.image_count = big_endian<std::int32_t>{header.image_count};
  header.image_width = big_endian<std::int32_t>{header.image_width};
  header.image_height = big_endian<std::int32_t>{header.image_height};

  if (header.image_width * header.image_height != 28 * 28) {
    throw std::runtime_error("unexpected mnist image dimensions");
  }

  images.resize(static_cast<std::size_t>(header.image_count));
  wrapper.read(images.size(), images.data());
}